

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_bss_describe_coupon_detail.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1e58c::
Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Json2Array(Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Value *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec)

{
  bool bVar1;
  ArrayIndex AVar2;
  Value *this_00;
  uint index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  value_type local_70;
  string local_50;
  
  bVar1 = Json::Value::isArray((Value *)this);
  if (bVar1) {
    AVar2 = Json::Value::size((Value *)this);
    if (AVar2 != 0) {
      index = 0;
      do {
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        this_00 = Json::Value::operator[]((Value *)this,index);
        Json::Value::asString_abi_cxx11_(&local_50,this_00);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)value,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        index = index + 1;
        AVar2 = Json::Value::size((Value *)this);
      } while (index < AVar2);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }